

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void Cmd_echo(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  char *local_58;
  FString local_30;
  FString formatted;
  int i;
  int last;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  for (formatted.Chars._4_4_ = 1; formatted.Chars._4_4_ <= iVar1 + -1;
      formatted.Chars._4_4_ = formatted.Chars._4_4_ + 1) {
    FCommandLine::operator[](argv,formatted.Chars._4_4_);
    strbin1((char *)&local_30);
    pcVar2 = FString::GetChars(&local_30);
    if (formatted.Chars._4_4_ == iVar1 + -1) {
      local_58 = "\n";
    }
    else {
      local_58 = " ";
    }
    Printf("%s%s",pcVar2,local_58);
    FString::~FString(&local_30);
  }
  return;
}

Assistant:

CCMD (echo)
{
	int last = argv.argc()-1;
	for (int i = 1; i <= last; ++i)
	{
		FString formatted = strbin1 (argv[i]);
		Printf ("%s%s", formatted.GetChars(), i!=last ? " " : "\n");
	}
}